

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeDeleteRowid(Rtree *pRtree,sqlite3_int64 iDelete)

{
  long lVar1;
  int iVar2;
  int iVar3;
  RtreeNode *in_RSI;
  Rtree *in_RDI;
  long in_FS_OFFSET;
  i64 iChild;
  int rc2_1;
  int rc2;
  int rc;
  RtreeNode *pChild;
  RtreeNode *pRoot;
  int iCell;
  RtreeNode *pLeaf;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Rtree *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  RtreeNode *in_stack_ffffffffffffffd8;
  RtreeNode *pParent;
  long iNode;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar4;
  RtreeNode *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0xaaaaaaaa;
  iNode = 0;
  iVar2 = nodeAcquire((Rtree *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffe8),0,
                      in_stack_ffffffffffffffd8,(RtreeNode **)in_RDI);
  if (iVar2 == 0) {
    iVar2 = findLeafNode(in_RDI,(i64)in_RSI,(RtreeNode **)(ulong)in_stack_ffffffffffffffc0,
                         (sqlite3_int64 *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  if (iVar2 == 0) {
    sqlite3_bind_int64((sqlite3_stmt *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                       (sqlite_int64)in_stack_ffffffffffffffb0);
    sqlite3_step((sqlite3_stmt *)in_stack_ffffffffffffffd8);
    iVar2 = sqlite3_reset((sqlite3_stmt *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
  }
  if (((iVar2 == 0) && (0 < in_RDI->iDepth)) &&
     (iVar3 = readInt16((u8 *)(*(long *)(iNode + 0x18) + 2)), iVar3 == 1)) {
    pParent = (RtreeNode *)0x0;
    in_stack_ffffffffffffffb0 =
         (Rtree *)nodeGetRowid(in_stack_ffffffffffffffb0,
                               (RtreeNode *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    iVar2 = nodeAcquire((Rtree *)CONCAT44(uVar4,in_stack_ffffffffffffffe8),iNode,pParent,
                        (RtreeNode **)in_RDI);
    if (iVar2 == 0) {
      iVar2 = removeNode(in_RDI,in_RSI,0);
    }
    in_stack_ffffffffffffffbc =
         nodeRelease(in_stack_ffffffffffffffb0,
                     (RtreeNode *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (iVar2 == 0) {
      iVar2 = in_stack_ffffffffffffffbc;
    }
    if (iVar2 == 0) {
      in_RDI->iDepth = in_RDI->iDepth + -1;
      writeInt16(*(u8 **)(iNode + 0x18),in_RDI->iDepth);
      *(undefined4 *)(iNode + 0x14) = 1;
    }
  }
  local_10 = in_RDI->pDeleted;
  while (local_10 != (RtreeNode *)0x0) {
    if (iVar2 == 0) {
      iVar2 = reinsertNodeContent((Rtree *)(ulong)in_stack_ffffffffffffffc0,
                                  (RtreeNode *)
                                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    in_RDI->pDeleted = local_10->pNext;
    in_RDI->nNodeRef = in_RDI->nNodeRef - 1;
    sqlite3_free((void *)0x29c710);
    local_10 = in_RDI->pDeleted;
  }
  if (iVar2 == 0) {
    iVar2 = nodeRelease(in_stack_ffffffffffffffb0,
                        (RtreeNode *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    nodeRelease(in_stack_ffffffffffffffb0,
                (RtreeNode *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int rtreeDeleteRowid(Rtree *pRtree, sqlite3_int64 iDelete){
  int rc;                         /* Return code */
  RtreeNode *pLeaf = 0;           /* Leaf node containing record iDelete */
  int iCell;                      /* Index of iDelete cell in pLeaf */
  RtreeNode *pRoot = 0;           /* Root node of rtree structure */


  /* Obtain a reference to the root node to initialize Rtree.iDepth */
  rc = nodeAcquire(pRtree, 1, 0, &pRoot);

  /* Obtain a reference to the leaf node that contains the entry
  ** about to be deleted.
  */
  if( rc==SQLITE_OK ){
    rc = findLeafNode(pRtree, iDelete, &pLeaf, 0);
  }

#ifdef CORRUPT_DB
  assert( pLeaf!=0 || rc!=SQLITE_OK || CORRUPT_DB );
#endif

  /* Delete the cell in question from the leaf node. */
  if( rc==SQLITE_OK && pLeaf ){
    int rc2;
    rc = nodeRowidIndex(pRtree, pLeaf, iDelete, &iCell);
    if( rc==SQLITE_OK ){
      rc = deleteCell(pRtree, pLeaf, iCell, 0);
    }
    rc2 = nodeRelease(pRtree, pLeaf);
    if( rc==SQLITE_OK ){
      rc = rc2;
    }
  }

  /* Delete the corresponding entry in the <rtree>_rowid table. */
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(pRtree->pDeleteRowid, 1, iDelete);
    sqlite3_step(pRtree->pDeleteRowid);
    rc = sqlite3_reset(pRtree->pDeleteRowid);
  }

  /* Check if the root node now has exactly one child. If so, remove
  ** it, schedule the contents of the child for reinsertion and
  ** reduce the tree height by one.
  **
  ** This is equivalent to copying the contents of the child into
  ** the root node (the operation that Gutman's paper says to perform
  ** in this scenario).
  */
  if( rc==SQLITE_OK && pRtree->iDepth>0 && NCELL(pRoot)==1 ){
    int rc2;
    RtreeNode *pChild = 0;
    i64 iChild = nodeGetRowid(pRtree, pRoot, 0);
    rc = nodeAcquire(pRtree, iChild, pRoot, &pChild);  /* tag-20210916a */
    if( rc==SQLITE_OK ){
      rc = removeNode(pRtree, pChild, pRtree->iDepth-1);
    }
    rc2 = nodeRelease(pRtree, pChild);
    if( rc==SQLITE_OK ) rc = rc2;
    if( rc==SQLITE_OK ){
      pRtree->iDepth--;
      writeInt16(pRoot->zData, pRtree->iDepth);
      pRoot->isDirty = 1;
    }
  }

  /* Re-insert the contents of any underfull nodes removed from the tree. */
  for(pLeaf=pRtree->pDeleted; pLeaf; pLeaf=pRtree->pDeleted){
    if( rc==SQLITE_OK ){
      rc = reinsertNodeContent(pRtree, pLeaf);
    }
    pRtree->pDeleted = pLeaf->pNext;
    pRtree->nNodeRef--;
    sqlite3_free(pLeaf);
  }

  /* Release the reference to the root node. */
  if( rc==SQLITE_OK ){
    rc = nodeRelease(pRtree, pRoot);
  }else{
    nodeRelease(pRtree, pRoot);
  }

  return rc;
}